

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::
     TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
     ::scan(Planner *self,Expression **currp)

{
  Expression *pEVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
  *this;
  
  pEVar1 = *currp;
  if (pEVar1->_id == TryTableId) {
    Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                   ).
                   super_TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
               ,doLeaveTry,currp);
  }
  else if (pEVar1->_id == TryId) {
    this = &(self->
            super_WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
            ).
            super_TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
    ;
    Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                *)this,Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                       ::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
LAB_008f1a26:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar2 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar2 = lVar2 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
        ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                    *)this,scan,(Expression **)(pEVar1[4].type.id + lVar2));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                *)this,doLeaveTry,currp);
    if (pEVar1->_id != TryId) goto LAB_008f1a26;
    Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
                *)this,scan,(Expression **)(pEVar1 + 2));
    goto LAB_008f19d8;
  }
  PostWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
  ::scan(self,currp);
  if (pEVar1->_id != TryTableId) {
    return;
  }
LAB_008f19d8:
  Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
              *)&(self->
                 super_WalkerPass<wasm::TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>_>
                 ).
                 super_TryDepthWalker<wasm::(anonymous_namespace)::Planner,_wasm::Visitor<wasm::(anonymous_namespace)::Planner,_void>_>
             ,doEnterTry,currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    if (curr->is<Try>()) {
      self->pushTask(SubType::doVisitTry, currp);
      auto& catchBodies = curr->cast<Try>()->catchBodies;
      for (int i = int(catchBodies.size()) - 1; i >= 0; i--) {
        self->pushTask(SubType::scan, &catchBodies[i]);
      }
      self->pushTask(SubType::doLeaveTry, currp);
      self->pushTask(SubType::scan, &curr->cast<Try>()->body);
      self->pushTask(SubType::doEnterTry, currp);
      return;
    }

    if (curr->is<TryTable>()) {
      self->pushTask(SubType::doLeaveTry, currp);
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    if (curr->is<TryTable>()) {
      self->pushTask(SubType::doEnterTry, currp);
    }
  }